

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O2

void SystemZ_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  byte bVar2;
  ushort uVar3;
  cs_detail *pcVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  MCOperand *pMVar9;
  int64_t iVar10;
  ulong uVar11;
  char *pcVar12;
  int iStack_40;
  
  uVar7 = MCInst_getOpcode(MI);
  uVar7 = *(uint *)(printInstruction_OpInfo0 + (ulong)uVar7 * 4);
  uVar8 = MCInst_getOpcode(MI);
  uVar3 = *(ushort *)(printInstruction_OpInfo1 + (ulong)uVar8 * 2);
  uVar8 = MCInst_getOpcode(MI);
  bVar2 = printInstruction_OpInfo2[uVar8];
  SStream_concat0(O,&UNK_004da68f + (uVar7 & 0x3fff));
  switch(uVar7 >> 0xe & 0x1f) {
  case 2:
    printBDAddrOperand(MI,0,O);
    break;
  case 3:
    printBDLAddrOperand(MI,0,O);
    break;
  case 4:
    iStack_40 = 0;
    goto LAB_002335bb;
  case 5:
    printCond4Operand(MI,1,O);
    break;
  case 6:
    printU4ImmOperand(MI,0,O);
    goto LAB_0023344b;
  case 7:
    iVar5 = 2;
    goto LAB_00233423;
  case 8:
    printCond4Operand(MI,3,O);
    SStream_concat0(O,anon_var_dwarf_2c0c85 + 0x11);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    goto switchD_0023397d_caseD_a;
  case 9:
    printU16ImmOperand(MI,0,O);
    break;
  case 10:
    printU32ImmOperand(MI,0,O);
    pcVar12 = ",";
    goto LAB_00233452;
  case 0xb:
    pMVar9 = MCInst_getOperand(MI,0);
    iVar10 = MCOperand_getImm(pMVar9);
    printInt64(O,iVar10);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar4 = MI->flat_insn->detail;
      puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[0] * 0x20 + 0x15;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar4 = MI->flat_insn->detail;
      *(int64_t *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[0] * 0x20 + 0x1d) = iVar10;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
      *puVar1 = *puVar1 + '\x01';
    }
    SStream_concat0(O,",");
    break;
  case 0xc:
    iStack_40 = 0;
    goto LAB_00233bd1;
  case 0xd:
    printOperand(MI,1,O);
    SStream_concat0(O,", ");
  case 1:
    printOperand(MI,0,O);
    break;
  case 0xe:
    printCond4Operand(MI,5,O);
    SStream_concat0(O,anon_var_dwarf_2c0c85 + 0x11);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    goto switchD_00233868_caseD_6;
  case 0xf:
    iVar5 = 4;
LAB_00233423:
    printCond4Operand(MI,iVar5,O);
    SStream_concat0(O,anon_var_dwarf_2c0c85 + 0x11);
    printOperand(MI,0,O);
LAB_0023344b:
    pcVar12 = ", ";
LAB_00233452:
    SStream_concat0(O,pcVar12);
    break;
  case 0x10:
    printBDRAddrOperand(MI,0,O);
    SStream_concat0(O,", ");
    printBDAddrOperand(MI,3,O);
    SStream_concat0(O,", ");
    goto switchD_00233b75_caseD_7;
  case 0x11:
    iStack_40 = 0;
    goto LAB_00233916;
  default:
    goto switchD_0023329b_default;
  }
  switch(uVar7 >> 0x13 & 0x1f) {
  case 1:
    pcVar12 = anon_var_dwarf_2c0c85 + 0x11;
    goto LAB_00233660;
  case 2:
    iStack_40 = 1;
    goto LAB_002335bb;
  case 3:
    pcVar12 = "r\t";
    goto LAB_002335ee;
  case 4:
    printOperand(MI,1,O);
    break;
  case 5:
    printPCRelOperand(MI,1,O);
    break;
  case 6:
    goto switchD_0023329b_default;
  case 7:
    printS8ImmOperand(MI,1,O);
  default:
switchD_0023347d_default:
    pcVar12 = ", ";
LAB_00233660:
    SStream_concat0(O,pcVar12);
    break;
  case 8:
    iStack_40 = 1;
    goto LAB_00233981;
  case 9:
    iStack_40 = 1;
    goto LAB_00233631;
  case 10:
    printU8ImmOperand(MI,1,O);
    goto switchD_0023347d_default;
  case 0xb:
    SStream_concat0(O,",");
    printOperand(MI,1,O);
    pcVar12 = ",";
LAB_002335ee:
    SStream_concat0(O,pcVar12);
switchD_0023347d_caseD_e:
    iStack_40 = 2;
    goto LAB_002335f5;
  case 0xc:
    printBDAddrOperand(MI,1,O);
    break;
  case 0xd:
    printBDRAddrOperand(MI,1,O);
    SStream_concat0(O,",");
    printBDAddrOperand(MI,4,O);
    SStream_concat0(O,",");
    iStack_40 = 6;
    goto LAB_002335f5;
  case 0xe:
    goto switchD_0023347d_caseD_e;
  case 0xf:
    goto switchD_0023347d_caseD_f;
  case 0x10:
    iStack_40 = 1;
    goto LAB_002336f9;
  }
  switch(uVar7 >> 0x18 & 0x3f) {
  case 1:
    iVar5 = 2;
    goto LAB_00233733;
  case 2:
    iVar5 = 1;
LAB_00233733:
    printOperand(MI,iVar5,O);
    break;
  case 3:
    iStack_40 = 2;
    goto LAB_00233746;
  case 4:
    iVar5 = 2;
    goto LAB_00233720;
  case 5:
    iStack_40 = 2;
    goto LAB_002338f6;
  case 6:
    goto switchD_0023368b_caseD_6;
  case 7:
    iStack_40 = 3;
    goto LAB_00233791;
  case 8:
    iVar5 = 1;
    goto LAB_00233830;
  case 9:
    goto switchD_0023329b_default;
  case 10:
    goto switchD_0023368b_caseD_a;
  case 0xb:
  case 0x10:
    iStack_40 = 1;
    goto LAB_00233bd1;
  case 0xc:
    goto switchD_0023368b_caseD_c;
  case 0xd:
    printU4ImmOperand(MI,1,O);
    goto switchD_0023368b_caseD_a;
  case 0xe:
    printBDLAddrOperand(MI,1,O);
    goto LAB_002336e8;
  case 0xf:
    iStack_40 = 1;
LAB_00233746:
    printS32ImmOperand(MI,iStack_40,O);
    return;
  case 0x11:
    iVar5 = 1;
LAB_00233720:
    printS16ImmOperand(MI,iVar5,O);
    break;
  case 0x12:
    iVar5 = 3;
    goto LAB_0023377e;
  case 0x13:
    printS8ImmOperand(MI,1,O);
    goto switchD_0023368b_caseD_a;
  case 0x14:
    goto switchD_0023368b_caseD_14;
  case 0x15:
    iStack_40 = 2;
    goto LAB_00233631;
  case 0x16:
    iStack_40 = 1;
    goto LAB_00233873;
  case 0x17:
    printU16ImmOperand(MI,1,O);
    break;
  case 0x18:
    printU8ImmOperand(MI,1,O);
    goto switchD_0023368b_caseD_a;
  case 0x19:
    printU4ImmOperand(MI,3,O);
    break;
  case 0x1a:
    iVar5 = 1;
    goto LAB_0023377e;
  case 0x1b:
    iStack_40 = 2;
    goto LAB_00233916;
  case 0x1c:
    iVar5 = 2;
LAB_0023377e:
    printBDAddrOperand(MI,iVar5,O);
    break;
  case 0x1d:
    printU4ImmOperand(MI,2,O);
    SStream_concat0(O,", ");
    goto switchD_00233b75_caseD_5;
  case 0x1e:
    pcVar12 = ",";
    goto LAB_002337f0;
  case 0x1f:
    iStack_40 = 2;
LAB_00233791:
    printBDLAddrOperand(MI,iStack_40,O);
    return;
  case 0x20:
    iVar5 = 2;
    goto LAB_002337ad;
  case 0x21:
    iVar5 = 1;
LAB_002337ad:
    printBDVAddrOperand(MI,iVar5,O);
switchD_0023368b_caseD_a:
    pcVar12 = ", ";
LAB_002337f0:
    SStream_concat0(O,pcVar12);
    break;
  default:
    iVar5 = 2;
LAB_00233830:
    printBDXAddrOperand(MI,iVar5,O);
  }
  switch((uint)(CONCAT24(uVar3,uVar7) >> 0x1e) & 0x1f) {
  case 2:
    goto switchD_00233868_caseD_2;
  case 3:
    goto switchD_0023368b_caseD_c;
  case 4:
    printOperand(MI,2,O);
    break;
  case 5:
    printU4ImmOperand(MI,2,O);
  case 1:
    SStream_concat0(O,", ");
    break;
  case 6:
switchD_00233868_caseD_6:
    iStack_40 = 2;
    goto LAB_00233407;
  case 7:
    printBDAddrOperand(MI,3,O);
    break;
  case 8:
    goto switchD_0023368b_caseD_14;
  case 9:
    goto switchD_0023347d_caseD_f;
  case 10:
switchD_0023368b_caseD_6:
    iStack_40 = 2;
LAB_00233873:
    printU32ImmOperand(MI,iStack_40,O);
    return;
  case 0xb:
    printS8ImmOperand(MI,2,O);
    SStream_concat0(O,",");
    printU4ImmOperand(MI,3,O);
    goto LAB_002338c8;
  case 0xc:
    iStack_40 = 3;
LAB_002338f6:
    printS8ImmOperand(MI,iStack_40,O);
    return;
  case 0xd:
    iStack_40 = 3;
LAB_00233631:
    printU16ImmOperand(MI,iStack_40,O);
    return;
  case 0xe:
    iStack_40 = 3;
LAB_00233916:
    printU8ImmOperand(MI,iStack_40,O);
    return;
  case 0xf:
    goto switchD_00233868_caseD_f;
  case 0x10:
    goto switchD_00233868_caseD_10;
  case 0x11:
    printU8ImmOperand(MI,2,O);
    break;
  case 0x12:
    goto switchD_00233868_caseD_12;
  case 0x13:
    goto switchD_00233868_caseD_13;
  default:
    goto switchD_0023329b_default;
  }
  switch(uVar3 >> 3 & 0x3f) {
  case 1:
switchD_0023347d_caseD_f:
    iStack_40 = 2;
LAB_00233981:
    printS16ImmOperand(MI,iStack_40,O);
    return;
  case 2:
    goto switchD_0023368b_caseD_14;
  case 3:
    iVar5 = 3;
    goto LAB_00233a2b;
  case 4:
    SStream_concat0(O,", ");
  case 0x10:
    iStack_40 = 3;
    goto LAB_002336f9;
  case 5:
    goto switchD_0023329b_default;
  case 6:
    printU4ImmOperand(MI,2,O);
    break;
  case 7:
    iVar5 = 2;
LAB_00233a2b:
    printBDAddrOperand(MI,iVar5,O);
    break;
  case 8:
switchD_0023368b_caseD_c:
    iStack_40 = 2;
    goto LAB_00233bd1;
  case 9:
    goto switchD_0023397d_caseD_9;
  case 10:
switchD_0023397d_caseD_a:
    iStack_40 = 1;
    goto LAB_00233407;
  case 0xb:
    iVar5 = 1;
    goto LAB_00233b20;
  case 0xc:
    iStack_40 = 4;
    goto LAB_002335f5;
  case 0xd:
    goto switchD_0023397d_caseD_d;
  case 0xe:
    iVar5 = 3;
    goto LAB_00233b20;
  case 0xf:
    pcVar12 = ",";
    goto LAB_00233a7c;
  case 0x11:
    goto switchD_0023397d_caseD_11;
  case 0x12:
switchD_00233868_caseD_2:
    iStack_40 = 2;
    goto LAB_002335bb;
  case 0x13:
    printU8ImmOperand(MI,3,O);
    break;
  case 0x14:
    goto switchD_0023397d_caseD_14;
  case 0x15:
    printU8ImmOperand(MI,2,O);
    pcVar12 = ", ";
LAB_00233a7c:
    SStream_concat0(O,pcVar12);
    break;
  case 0x16:
    pMVar9 = MCInst_getOperand(MI,2);
    iVar10 = MCOperand_getImm(pMVar9);
    printInt64(O,iVar10);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar4 = MI->flat_insn->detail;
      puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[0] * 0x20 + 0x15;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar4 = MI->flat_insn->detail;
      *(int64_t *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[0] * 0x20 + 0x1d) = iVar10;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
      *puVar1 = *puVar1 + '\x01';
    }
    break;
  case 0x17:
switchD_00233868_caseD_f:
    iStack_40 = 5;
    goto LAB_002339c8;
  case 0x18:
switchD_00233868_caseD_10:
    iStack_40 = 5;
    goto LAB_002339ac;
  case 0x19:
    iStack_40 = 5;
    goto LAB_00233a3e;
  case 0x1a:
    iStack_40 = 3;
    goto LAB_002339c8;
  case 0x1b:
    iStack_40 = 3;
    goto LAB_002339ac;
  case 0x1c:
    iStack_40 = 3;
    goto LAB_00233a3e;
  case 0x1d:
    printU16ImmOperand(MI,2,O);
    break;
  case 0x1e:
switchD_00233868_caseD_12:
    iStack_40 = 4;
LAB_002339c8:
    printU2ImmOperand(MI,iStack_40,O);
    return;
  case 0x1f:
switchD_00233868_caseD_13:
    iStack_40 = 4;
LAB_002339ac:
    printU1ImmOperand(MI,iStack_40,O);
    return;
  case 0x20:
    iStack_40 = 4;
LAB_00233a3e:
    printU3ImmOperand(MI,iStack_40,O);
    return;
  default:
    iVar5 = 2;
LAB_00233b20:
    printOperand(MI,iVar5,O);
  }
  switch(uVar3 >> 9 & 0xf) {
  case 1:
    SStream_concat0(O,", ");
    break;
  case 2:
    goto switchD_0023368b_caseD_14;
  case 3:
    printOperand(MI,3,O);
    pcVar12 = ",";
    goto LAB_002336ef;
  case 4:
    printU4ImmOperand(MI,3,O);
    break;
  case 5:
    goto switchD_00233b75_caseD_5;
  case 6:
switchD_0023397d_caseD_11:
    iStack_40 = 3;
LAB_002335bb:
    printBDXAddrOperand(MI,iStack_40,O);
    return;
  case 7:
switchD_00233b75_caseD_7:
    iStack_40 = 5;
LAB_002335f5:
    printOperand(MI,iStack_40,O);
    return;
  case 8:
    printU8ImmOperand(MI,3,O);
LAB_002336e8:
    pcVar12 = ", ";
LAB_002336ef:
    SStream_concat0(O,pcVar12);
    goto switchD_0023397d_caseD_d;
  default:
    goto switchD_0023329b_default;
  }
  switch(((uint)(((ulong)bVar2 << 0x30) >> 0x20) | (uint)uVar3) >> 0xd & 0xf) {
  case 1:
switchD_00233b75_caseD_5:
    iStack_40 = 3;
    goto LAB_00233407;
  case 2:
switchD_0023368b_caseD_14:
    iStack_40 = 3;
LAB_00233bd1:
    printPCRelOperand(MI,iStack_40,O);
    return;
  case 3:
switchD_0023397d_caseD_d:
    iStack_40 = 4;
    goto LAB_002336f9;
  case 4:
LAB_002338c8:
    SStream_concat0(O,",");
  case 5:
switchD_0023397d_caseD_9:
    iStack_40 = 4;
LAB_00233407:
    printBDAddrOperand(MI,iStack_40,O);
    return;
  case 6:
    iVar5 = 4;
    goto LAB_00233c21;
  case 7:
    printOperand(MI,3,O);
    break;
  case 8:
    iVar5 = 3;
LAB_00233c21:
    printU8ImmOperand(MI,iVar5,O);
    break;
  case 9:
    goto switchD_0023329b_default;
  case 10:
    goto switchD_0023397d_caseD_14;
  default:
    printU4ImmOperand(MI,3,O);
  }
  if ((bVar2 & 2) == 0) {
switchD_0023329b_default:
    return;
  }
  SStream_concat0(O,", ");
  bVar6 = bVar2 >> 2 & 3;
  if (bVar6 == 1) {
    printU4ImmOperand(MI,4,O);
    if ((bVar2 & 0x10) == 0) {
      return;
    }
    SStream_concat0(O,", ");
  }
  else if (bVar6 != 2) {
    pMVar9 = MCInst_getOperand(MI,5);
    uVar11 = MCOperand_getImm(pMVar9);
    printUInt32(O,(uint32_t)uVar11);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar4 = MI->flat_insn->detail;
    puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[0] * 0x20 + 0x15;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar4 = MI->flat_insn->detail;
    *(ulong *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[0] * 0x20 + 0x1d) =
         uVar11 & 0xffffffff;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
    *puVar1 = *puVar1 + '\x01';
    return;
  }
switchD_0023397d_caseD_14:
  iStack_40 = 5;
LAB_002336f9:
  printU4ImmOperand(MI,iStack_40,O);
  return;
}

Assistant:

void SystemZ_printInst(MCInst *MI, SStream *O, void *Info)
{
	printInstruction(MI, O, Info);
}